

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc_error_estimator.cpp
# Opt level: O0

float __thiscall ltc_error_estimator::estimate_error(ltc_error_estimator *this,vec3 parameters)

{
  double dVar1;
  anon_union_8_3_e2189aaa_for_vec<2,_float,_(glm::precision)0>_3 aStack_f0;
  float final_error;
  vec2 random_sample;
  int j;
  int i;
  halton_sampler2d sampler2d;
  undefined1 local_c0 [8];
  ltc ltc;
  double total_error;
  int num_samples;
  ltc_error_estimator *this_local;
  undefined1 local_14 [8];
  vec3 parameters_local;
  
  parameters_local.field_0.field_0.x = (float)parameters.field_0._8_4_;
  local_14 = parameters.field_0._0_8_;
  if ((this->_force_isotropy & 1U) != 0) {
    local_14._0_4_ = parameters.field_0._0_4_;
    local_14._4_4_ = local_14._0_4_;
    parameters_local.field_0.field_0.x = 0.0;
  }
  ltc._ltc_matrix_inv.value[2].field_0._4_8_ = 0;
  ::ltc::ltc((ltc *)local_c0);
  ::ltc::set_amplitude((ltc *)local_c0,this->_amplitude);
  ::ltc::set_base_frame((ltc *)local_c0,&this->_base_frame);
  ::ltc::set_ltc_parameters((ltc *)local_c0,(vec3 *)local_14);
  halton_sampler2d::halton_sampler2d((halton_sampler2d *)&j);
  for (random_sample.field_0.field_0.y = 0.0; (int)random_sample.field_0.field_0.y < 0x20;
      random_sample.field_0.field_0.y = (float)((int)random_sample.field_0.field_0.y + 1)) {
    for (random_sample.field_0.field_0.x = 0.0; (int)random_sample.field_0.field_0.x < 0x20;
        random_sample.field_0.field_0.x = (float)((int)random_sample.field_0.field_0.x + 1)) {
      aStack_f0.field_0 =
           (anon_struct_8_2_947311e6_for_anon_union_8_3_e2189aaa_for_vec<2,_float,_(glm::precision)0>_3_0
            )halton_sampler2d::getNextSample((halton_sampler2d *)&j);
      dVar1 = estimate_partial_error
                        (this,(brdf *)local_c0,this->_brdf,(vec2 *)&stack0xffffffffffffff10);
      ltc._ltc_matrix_inv.value[2].field_0._4_8_ =
           (double)ltc._ltc_matrix_inv.value[2].field_0._4_8_ + dVar1;
      dVar1 = estimate_partial_error
                        (this,this->_brdf,(brdf *)local_c0,(vec2 *)&stack0xffffffffffffff10);
      ltc._ltc_matrix_inv.value[2].field_0._4_8_ =
           dVar1 + (double)ltc._ltc_matrix_inv.value[2].field_0._4_8_;
    }
  }
  dVar1 = (double)ltc._ltc_matrix_inv.value[2].field_0._4_8_ / 1024.0;
  halton_sampler2d::~halton_sampler2d((halton_sampler2d *)&j);
  ::ltc::~ltc((ltc *)local_c0);
  return (float)dVar1;
}

Assistant:

float ltc_error_estimator::estimate_error(glm::vec3 parameters) const
{
  const int num_samples = 32;

  if (_force_isotropy)
  {
    parameters.y = parameters.x;
    parameters.z = 0.0f;
  }

  double total_error = 0.0f;

  ltc ltc;
  ltc.set_amplitude(_amplitude);
  ltc.set_base_frame(_base_frame);
  ltc.set_ltc_parameters(parameters);

  halton_sampler2d sampler2d;
  for (auto i = 0; i < num_samples; ++i)
  {
    for (auto j = 0; j < num_samples; ++j)
    {
      const auto random_sample = sampler2d.getNextSample();

      total_error += estimate_partial_error(ltc, _brdf, random_sample);
      total_error += estimate_partial_error(_brdf, ltc, random_sample);
    }
  }

  float final_error = static_cast<float>(total_error / static_cast<double>(num_samples * num_samples));
  return final_error;
}